

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O2

void __thiscall JetHead::vector<TestCase_*>::~vector(vector<TestCase_*> *this)

{
  if (this->mData != (TestCase **)0x0) {
    this->mSize = 0;
    operator_delete__(this->mData);
    this->mData = (TestCase **)0x0;
  }
  return;
}

Assistant:

~vector()
		{
			if (mData)
			{
				// Call all of our destructors for contained objects
				clear();
				
				// Free memory
				delete[] (uint8_t*)mData;
				mData = NULL;
			}
		}